

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiexsas.c
# Opt level: O2

void HTTPAPIEX_SAS_Destroy(HTTPAPIEX_SAS_HANDLE handle)

{
  HTTPAPIEX_SAS_STATE *state;
  
  if (handle != (HTTPAPIEX_SAS_HANDLE)0x0) {
    free(handle->key);
    free(handle->uriResource);
    free(handle->keyName);
    free(handle);
    return;
  }
  return;
}

Assistant:

void HTTPAPIEX_SAS_Destroy(HTTPAPIEX_SAS_HANDLE handle)
{
#ifdef _MSC_VER
#pragma warning(disable:6001) // Using uninitialized memory '*state'
#endif
    /*Codes_SRS_HTTPAPIEXSAS_06_005: [If the parameter handle is NULL then HTTAPIEX_SAS_Destroy shall do nothing and return.]*/
    HTTPAPIEX_SAS_STATE* state = (HTTPAPIEX_SAS_STATE*)handle;
    if (state != NULL)
    {
        /*Codes_SRS_HTTPAPIEXSAS_06_006: [HTTAPIEX_SAS_Destroy shall deallocate any structures denoted by the parameter handle.]*/
        if (state->key)
        {
            free(state->key);
        }
        if (state->uriResource)
        {
            free(state->uriResource);
        }
        if (state->keyName)
        {
            free(state->keyName);
        }
        free(state);
    }
#ifdef _MSC_VER
#pragma warning (default:6001)
#endif
}